

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O1

void TestConstExpr::ConstCastTestT<unsigned_long>(void)

{
  if (ConstCastTestT<unsigned_long>()::b == '\0') {
    ConstCastTestT<unsigned_long>();
  }
  if (ConstCastTestT<unsigned_long>()::w == '\0') {
    ConstCastTestT<unsigned_long>();
  }
  if (ConstCastTestT<unsigned_long>()::c == '\0') {
    ConstCastTestT<unsigned_long>();
  }
  if (ConstCastTestT<unsigned_long>()::sc == '\0') {
    ConstCastTestT<unsigned_long>();
  }
  if (ConstCastTestT<unsigned_long>()::uc == '\0') {
    ConstCastTestT<unsigned_long>();
  }
  if (ConstCastTestT<unsigned_long>()::s == '\0') {
    ConstCastTestT<unsigned_long>();
  }
  if (ConstCastTestT<unsigned_long>()::us == '\0') {
    ConstCastTestT<unsigned_long>();
  }
  if (ConstCastTestT<unsigned_long>()::i == '\0') {
    ConstCastTestT<unsigned_long>();
  }
  if (ConstCastTestT<unsigned_long>()::ui == '\0') {
    ConstCastTestT<unsigned_long>();
  }
  if (ConstCastTestT<unsigned_long>()::l == '\0') {
    ConstCastTestT<unsigned_long>();
  }
  if (ConstCastTestT<unsigned_long>()::ul == '\0') {
    ConstCastTestT<unsigned_long>();
  }
  if (ConstCastTestT<unsigned_long>()::ll == '\0') {
    ConstCastTestT<unsigned_long>();
  }
  if (ConstCastTestT<unsigned_long>()::ull == '\0') {
    ConstCastTestT<unsigned_long>();
  }
  if (ConstCastTestT<unsigned_long>()::st == '\0') {
    ConstCastTestT<unsigned_long>();
  }
  if (ConstCastTestT<unsigned_long>()::pt == '\0') {
    ConstCastTestT<unsigned_long>();
  }
  if (ConstCastTestT<unsigned_long>()::pl == '\0') {
    ConstCastTestT<unsigned_long>();
  }
  return;
}

Assistant:

void ConstCastTestT()
	{
		static const bool b = ConstSafeInt<T>();
		static const wchar_t w = ConstSafeInt<T>();
		static const char c = ConstSafeInt<T>();
		static const signed char sc = ConstSafeInt<T>();
		static const unsigned char uc = ConstSafeInt<T>();
		static const signed short s = ConstSafeInt<T>();
		static const unsigned short us = ConstSafeInt<T>();
		static const signed int i = ConstSafeInt<T>();
		static const unsigned int ui = ConstSafeInt<T>();
		static const signed long l = ConstSafeInt<T>();
		static const unsigned long ul = ConstSafeInt<T>();
		static const signed long long ll = ConstSafeInt<T>();
		static const unsigned long long ull = ConstSafeInt<T>();
		static const size_t st = ConstSafeInt<T>();
		static const ptrdiff_t pt = ConstSafeInt<T>();

		// Also catch the useless unary + operator
		static const int pl = +ConstSafeInt<T>();
	}